

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  MaybeUint MVar1;
  NodeUnion *pNVar2;
  char cVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  undefined4 in_register_00000084;
  uint uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  Fault f_1;
  Fault local_78;
  MaybeUint local_6c;
  BTreeImpl *local_68;
  uint local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000084,height);
  pNVar2 = this->tree;
  local_6c.i = maxRow.i;
  local_48 = size;
  if (height == 0) {
    iVar11 = 7;
    if (pNVar2[pos].field_0.freelist.zero[7] == 0) {
      iVar11 = 0;
    }
    uVar5 = (uint)(*(int *)((long)&pNVar2[pos].field_0 + (ulong)(uint)(iVar11 * 4) + 0x14) != 0);
    iVar9 = iVar11 + uVar5 * 4;
    bVar13 = *(int *)((long)&pNVar2[pos].field_0 + (ulong)(uint)(iVar9 * 4) + 0xc) != 0;
    uVar10 = iVar9 + (uint)bVar13 * 2;
    uVar6 = (uint)(*(int *)((long)&pNVar2[pos].field_0 + (ulong)uVar10 * 4 + 8) != 0);
    uVar10 = uVar10 + uVar6;
    sVar4 = (size_t)uVar10;
    if (uVar10 != 0) {
      local_68 = (BTreeImpl *)(ulong)(uVar10 - 1);
      lVar7 = 0;
      do {
        uVar8 = (ulong)(*(int *)((long)&pNVar2[pos].field_0 + lVar7 * 4 + 8) - 1);
        if (size <= uVar8) {
          local_78.exception = (Exception *)0x0;
          local_58 = 0;
          uStack_50 = 0;
          Debug::Fault::init(&local_78,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_78);
        }
        if ((int)lVar7 + 1U < uVar10) {
          cVar3 = (**f->space[0])(f,uVar8,*(int *)((long)&pNVar2[pos].field_0 + lVar7 * 4 + 0xc) +
                                          -1);
          size = local_48;
          maxRow.i = local_6c.i;
          if (cVar3 == '\0') {
            local_78.exception = (Exception *)0x0;
            local_58 = 0;
            uStack_50 = 0;
            Debug::Fault::init(&local_78,
                               (EVP_PKEY_CTX *)
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              );
            Debug::Fault::fatal(&local_78);
          }
        }
        else if ((maxRow.i != 0) &&
                (*(uint *)((long)&pNVar2[pos].field_0 + (long)local_68 * 4 + 8) != maxRow.i)) {
          local_78.exception = (Exception *)0x0;
          local_58 = 0;
          uStack_50 = 0;
          Debug::Fault::init(&local_78,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_78);
        }
        lVar7 = lVar7 + 1;
      } while ((uint)bVar13 * 2 + iVar11 + uVar5 * 4 + uVar6 != (int)lVar7);
    }
  }
  else {
    bVar13 = pNVar2[pos].field_0.freelist.zero[3] != 0;
    iVar11 = (uint)bVar13 * 4;
    bVar13 = *(int *)((long)&pNVar2[pos].field_0 + (ulong)bVar13 * 0x10 + 8) != 0;
    uVar6 = iVar11 + (uint)bVar13 * 2;
    uVar5 = (uint)(*(int *)((long)&pNVar2[pos].field_0 + (ulong)uVar6 * 4 + 4) != 0);
    uVar6 = uVar6 | uVar5;
    local_40 = (ulong)uVar6;
    local_68 = this;
    if (uVar6 == 0) {
      lVar7 = 0;
    }
    else {
      local_5c = height - 1;
      iVar11 = iVar11 + (uint)bVar13 * 2 + uVar5;
      lVar12 = 0;
      lVar7 = 0;
      do {
        MVar1.i = *(uint *)((long)&pNVar2[pos].field_0 + lVar12 * 4 + 4);
        if (local_48 <= MVar1.i - 1) {
          local_78.exception = (Exception *)0x0;
          local_58 = 0;
          uStack_50 = 0;
          Debug::Fault::init(&local_78,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_78);
        }
        sVar4 = verifyNode(local_68,local_48,f,
                           *(uint *)((long)&pNVar2[pos].field_0 + lVar12 * 4 + 0x20),local_5c,MVar1)
        ;
        if (((int)lVar12 - iVar11 != -1) &&
           (cVar3 = (**f->space[0])(f,*(int *)((long)&pNVar2[pos].field_0 + lVar12 * 4 + 4) + -1,
                                    *(int *)((long)&pNVar2[pos].field_0 + lVar12 * 4 + 8) + -1),
           cVar3 == '\0')) {
          local_78.exception = (Exception *)0x0;
          local_58 = 0;
          uStack_50 = 0;
          Debug::Fault::init(&local_78,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_78);
        }
        lVar7 = lVar7 + sVar4;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != iVar11);
    }
    uVar8 = local_40;
    MVar1.i = local_6c.i;
    sVar4 = verifyNode(local_68,local_48,f,
                       *(uint *)((long)&pNVar2[pos].field_0 + local_40 * 4 + 0x20),(int)local_38 - 1
                       ,local_6c);
    sVar4 = sVar4 + lVar7;
    if ((MVar1.i != 0) &&
       (cVar3 = (**f->space[0])(f,*(int *)((long)&pNVar2[pos].field_0 +
                                          (ulong)((int)uVar8 - 1) * 4 + 4) + -1,MVar1.i - 1),
       cVar3 == '\0')) {
      local_78.exception = (Exception *)0x0;
      local_58 = 0;
      uStack_50 = 0;
      Debug::Fault::init(&local_78,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        );
      Debug::Fault::fatal(&local_78);
    }
  }
  return sVar4;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      KJ_ASSERT(i + 1 == n || f(*parent.keys[i], *parent.keys[i + 1]));
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    KJ_ASSERT(maxRow == nullptr || f(*parent.keys[n-1], *maxRow));
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size);
      if (i + 1 < n) {
        KJ_ASSERT(f(*leaf.rows[i], *leaf.rows[i + 1]));
      } else {
        KJ_ASSERT(maxRow == nullptr || leaf.rows[n-1] == maxRow);
      }
    }
    return n;
  }
}